

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void * c4::arealloc(void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  code *UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  undefined8 local_30;
  
  UNRECOVERED_JUMPTABLE = (code *)detail::s_arealloc;
  if (detail::s_arealloc == (undefined *)0x0) {
    arealloc();
    UNRECOVERED_JUMPTABLE = local_30;
  }
  pvVar1 = (void *)(*UNRECOVERED_JUMPTABLE)(ptr,oldsz,newsz,alignment);
  return pvVar1;
}

Assistant:

void* arealloc(void *ptr, size_t oldsz, size_t newsz, size_t alignment)
{
    C4_ASSERT_MSG(c4::get_arealloc() != nullptr, "did you forget to call set_arealloc()?");
    auto fn = c4::get_arealloc();
    void* nptr = fn(ptr, oldsz, newsz, alignment);
    return nptr;
}